

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTWaveBank_GetNumWaves(FACTWaveBank *pWaveBank,uint16_t *pnNumWaves)

{
  undefined2 *in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  if (in_RDI != 0) {
    FAudio_PlatformLockMutex((FAudioMutex)0x11517c);
    *in_RSI = (short)*(undefined4 *)(in_RDI + 0x30);
    FAudio_PlatformUnlockMutex((FAudioMutex)0x1151a2);
  }
  else {
    *in_RSI = 0;
  }
  local_4 = (uint)(in_RDI == 0);
  return local_4;
}

Assistant:

uint32_t FACTWaveBank_GetNumWaves(
	FACTWaveBank *pWaveBank,
	uint16_t *pnNumWaves
) {
	if (pWaveBank == NULL)
	{
		*pnNumWaves = 0;
		return 1;
	}
	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
	*pnNumWaves = pWaveBank->entryCount;
	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}